

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O1

Qiniu_Error
Qiniu_RS_BatchChangeMime
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryChangeMime *entries,
          Qiniu_ItemCount entryCount)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *s1;
  char *addr;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar5;
  Qiniu_Int64 QVar6;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  Qiniu_Error QVar11;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  char *pcVar7;
  
  QVar11 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_40);
  pcVar7 = QVar11.message;
  uVar1 = QVar11.code;
  if (uVar1 == 200) {
    pcVar3 = Qiniu_String_Concat2(local_40,"/batch");
    if (entryCount < 1) {
      s3 = (char *)0x0;
    }
    else {
      lVar9 = 0;
      pcVar7 = (char *)0x0;
      do {
        pcVar4 = Qiniu_String_Concat3
                           (*(char **)((long)&entries->bucket + lVar9),":",
                            *(char **)((long)&entries->key + lVar9));
        s1 = Qiniu_String_Encode(pcVar4);
        addr = Qiniu_String_Encode(*(char **)((long)&entries->mime + lVar9));
        s2 = Qiniu_String_Concat(s1,"/mime/",addr,0);
        s3 = Qiniu_String_Concat2("op=/chgm/",s2);
        Qiniu_Free(pcVar4);
        Qiniu_Free(s1);
        Qiniu_Free(addr);
        Qiniu_Free(s2);
        if (pcVar7 != (char *)0x0) {
          pcVar4 = Qiniu_String_Concat3(pcVar7,"&",s3);
          free(s3);
          s3 = pcVar4;
        }
        free(pcVar7);
        lVar9 = lVar9 + 0x18;
        pcVar7 = s3;
      } while ((ulong)(uint)entryCount * 0x18 != lVar9);
    }
    bodyLen = strlen(s3);
    QVar11 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar3,s3,bodyLen,"application/x-www-form-urlencoded");
    pcVar7 = QVar11.message;
    uVar1 = QVar11.code;
    free(pcVar3);
    free(s3);
    uVar2 = cJSON_GetArraySize(local_38);
    if (0 < (int)uVar2) {
      piVar8 = &rets->code;
      uVar10 = 0;
      do {
        pcVar5 = cJSON_GetArrayItem(local_38,(int)uVar10);
        QVar6 = Qiniu_Json_GetInt64(pcVar5,"code",0);
        pcVar5 = cJSON_GetObjectItem(pcVar5,"data");
        *piVar8 = (int)QVar6;
        if ((int)QVar6 != 200) {
          pcVar3 = Qiniu_Json_GetString(pcVar5,"error",(char *)0x0);
          ((Qiniu_RS_BatchItemRet *)(piVar8 + -2))->error = pcVar3;
        }
        uVar10 = uVar10 + 1;
        piVar8 = piVar8 + 4;
      } while (uVar2 != uVar10);
    }
  }
  QVar11._4_4_ = 0;
  QVar11.code = uVar1;
  QVar11.message = pcVar7;
  return QVar11;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchChangeMime(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                     Qiniu_RS_EntryChangeMime *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *mimeEncoded, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryChangeMime *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);
        mimeEncoded = Qiniu_String_Encode(entry->mime);

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/mime/", mimeEncoded, NULL);
        opBody = Qiniu_String_Concat2("op=/chgm/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(mimeEncoded);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}